

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.cc
# Opt level: O0

ThreadCache * tcmalloc::ThreadCache::NewHeap(void)

{
  ThreadCache *pTVar1;
  SpinLock *l;
  ThreadCache *this;
  ThreadCache *heap;
  SpinLockHolder h;
  
  l = Static::pageheap_lock();
  SpinLockHolder::SpinLockHolder((SpinLockHolder *)&heap,l);
  this = PageHeapAllocator<tcmalloc::ThreadCache>::New
                   ((PageHeapAllocator<tcmalloc::ThreadCache> *)threadcache_allocator);
  ThreadCache(this);
  this->next_ = thread_heaps_;
  this->prev_ = (ThreadCache *)0x0;
  pTVar1 = this;
  if (thread_heaps_ != (ThreadCache *)0x0) {
    thread_heaps_->prev_ = this;
    pTVar1 = next_memory_steal_;
  }
  next_memory_steal_ = pTVar1;
  thread_heap_count_ = thread_heap_count_ + 1;
  thread_heaps_ = this;
  SpinLockHolder::~SpinLockHolder((SpinLockHolder *)&heap);
  return this;
}

Assistant:

ThreadCache* ThreadCache::NewHeap() {
  SpinLockHolder h(Static::pageheap_lock());

  // Create the heap and add it to the linked list
  ThreadCache *heap = new (threadcache_allocator.New()) ThreadCache();

  heap->next_ = thread_heaps_;
  heap->prev_ = nullptr;
  if (thread_heaps_ != nullptr) {
    thread_heaps_->prev_ = heap;
  } else {
    // This is the only thread heap at the momment.
    ASSERT(next_memory_steal_ == nullptr);
    next_memory_steal_ = heap;
  }
  thread_heaps_ = heap;
  thread_heap_count_++;
  return heap;
}